

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astDoWhileContinueWithNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t bodyExpression,
          sysbvm_tuple_t conditionExpression,sysbvm_tuple_t continueExpression)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).astDoWhileContinueWithNodeType,6);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = bodyExpression;
  psVar1[2].header.field_0.typePointer = conditionExpression;
  psVar1[2].header.identityHashAndFlags = (int)continueExpression;
  psVar1[2].header.objectSize = (int)(continueExpression >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astDoWhileContinueWithNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t bodyExpression, sysbvm_tuple_t conditionExpression, sysbvm_tuple_t continueExpression)
{
    sysbvm_astDoWhileContinueWithNode_t *result = (sysbvm_astDoWhileContinueWithNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astDoWhileContinueWithNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astDoWhileContinueWithNode_t));
    result->super.sourcePosition = sourcePosition;
    result->bodyExpression = bodyExpression;
    result->conditionExpression = conditionExpression;
    result->continueExpression = continueExpression;
    return (sysbvm_tuple_t)result;
}